

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O1

bool __thiscall
cmCTestTestHandler::AddTest
          (cmCTestTestHandler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  cmCTest *pcVar2;
  pointer pbVar3;
  size_t sVar4;
  size_t sVar5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  pointer pbVar9;
  ostringstream cmCTestLog_msg_3;
  cmCTestTestProperties test;
  long *local_4c8;
  long local_4b8 [2];
  undefined1 local_4a8 [16];
  _func_int *local_498 [12];
  ios_base local_438 [264];
  undefined1 local_330 [32];
  _Alloc_hider local_310;
  size_type local_308;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f0 [2];
  ios_base local_2c0 [216];
  ushort local_1e8;
  bool local_1e6;
  undefined8 local_1e4;
  bool local_1dc;
  cmDuration local_1d8;
  bool local_1d0;
  int local_1bc;
  bool local_1b8;
  int local_198;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"Add test: ",10);
  pbVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_330,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x953,(char *)local_4a8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
  if ((_func_int **)local_4a8._0_8_ != local_498) {
    operator_delete((void *)local_4a8._0_8_,(ulong)(local_498[0] + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_330);
  std::ios_base::~ios_base(local_2c0);
  if (((this->UseExcludeRegExpFlag != true) || (this->UseExcludeRegExpFirst != true)) ||
     (bVar6 = cmsys::RegularExpression::find
                        (&this->ExcludeTestsRegularExpression,(pbVar1->_M_dataplus)._M_p,
                         &(this->ExcludeTestsRegularExpression).regmatch), !bVar6)) {
    pbVar9 = (this->CustomTestsIgnore).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (this->CustomTestsIgnore).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (this->MemCheck == true) {
      if (pbVar9 != pbVar3) {
        sVar4 = pbVar1->_M_string_length;
        do {
          sVar5 = pbVar9->_M_string_length;
          if ((sVar5 == sVar4) &&
             ((sVar5 == 0 ||
              (iVar7 = bcmp((pbVar9->_M_dataplus)._M_p,(pbVar1->_M_dataplus)._M_p,sVar5), iVar7 == 0
              )))) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_330,"Ignore memcheck: ",0x11);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_330,(pbVar9->_M_dataplus)._M_p,
                                pbVar9->_M_string_length);
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,5,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                         ,0x965,(char *)local_4a8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
LAB_00172d99:
            if ((_func_int **)local_4a8._0_8_ != local_498) {
              operator_delete((void *)local_4a8._0_8_,(ulong)(local_498[0] + 1));
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_330);
            std::ios_base::~ios_base(local_2c0);
            return true;
          }
          pbVar9 = pbVar9 + 1;
        } while (pbVar9 != pbVar3);
      }
    }
    else if (pbVar9 != pbVar3) {
      sVar4 = pbVar1->_M_string_length;
      do {
        sVar5 = pbVar9->_M_string_length;
        if ((sVar5 == sVar4) &&
           ((sVar5 == 0 ||
            (iVar7 = bcmp((pbVar9->_M_dataplus)._M_p,(pbVar1->_M_dataplus)._M_p,sVar5), iVar7 == 0))
           )) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_330,"Ignore test: ",0xd);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_330,(pbVar9->_M_dataplus)._M_p,
                              pbVar9->_M_string_length);
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                       ,0x974,(char *)local_4a8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
          goto LAB_00172d99;
        }
        pbVar9 = pbVar9 + 1;
      } while (pbVar9 != pbVar3);
    }
    cmCTestTestProperties::cmCTestTestProperties((cmCTestTestProperties *)local_330);
    std::__cxx11::string::_M_assign((string *)local_330);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(local_2f0,args);
    cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&local_310,(string *)local_4a8);
    if ((_func_int **)local_4a8._0_8_ != local_498) {
      operator_delete((void *)local_4a8._0_8_,(ulong)(local_498[0] + 1));
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4a8,"Set test directory: ",0x14);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_4a8,local_310._M_p,local_308);
    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x97f,(char *)local_4c8,(this->super_cmCTestGenericHandler).Quiet);
    if (local_4c8 != local_4b8) {
      operator_delete(local_4c8,local_4b8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
    std::ios_base::~ios_base(local_438);
    local_1e8 = 1;
    local_1e6 = false;
    local_1dc = false;
    local_1d8.__r = 0.0;
    local_1d0 = false;
    local_1e4._0_4_ = 0.0;
    local_1e4._4_4_ = 0;
    local_1bc = 1;
    local_1b8 = false;
    local_198 = -1;
    if ((this->UseIncludeRegExpFlag == true) &&
       ((bVar6 = cmsys::RegularExpression::find
                           (&this->IncludeTestsRegularExpression,(pbVar1->_M_dataplus)._M_p,
                            &(this->IncludeTestsRegularExpression).regmatch), !bVar6 ||
        ((this->UseExcludeRegExpFirst == false &&
         (bVar6 = cmsys::RegularExpression::find
                            (&this->ExcludeTestsRegularExpression,(pbVar1->_M_dataplus)._M_p,
                             &(this->ExcludeTestsRegularExpression).regmatch), bVar6)))))) {
      local_1e8 = local_1e8 & 0xff00;
    }
    std::
    vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
    ::push_back(&this->TestList,(value_type *)local_330);
    cmCTestTestProperties::~cmCTestTestProperties((cmCTestTestProperties *)local_330);
  }
  return true;
}

Assistant:

bool cmCTestTestHandler::AddTest(const std::vector<std::string>& args)
{
  const std::string& testname = args[0];
  cmCTestOptionalLog(this->CTest, DEBUG, "Add test: " << args[0] << std::endl,
                     this->Quiet);

  if (this->UseExcludeRegExpFlag && this->UseExcludeRegExpFirst &&
      this->ExcludeTestsRegularExpression.find(testname)) {
    return true;
  }
  if (this->MemCheck) {
    std::vector<std::string>::iterator it;
    bool found = false;
    for (it = this->CustomTestsIgnore.begin();
         it != this->CustomTestsIgnore.end(); ++it) {
      if (*it == testname) {
        found = true;
        break;
      }
    }
    if (found) {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "Ignore memcheck: " << *it << std::endl, this->Quiet);
      return true;
    }
  } else {
    std::vector<std::string>::iterator it;
    bool found = false;
    for (it = this->CustomTestsIgnore.begin();
         it != this->CustomTestsIgnore.end(); ++it) {
      if (*it == testname) {
        found = true;
        break;
      }
    }
    if (found) {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "Ignore test: " << *it << std::endl, this->Quiet);
      return true;
    }
  }

  cmCTestTestProperties test;
  test.Name = testname;
  test.Args = args;
  test.Directory = cmSystemTools::GetCurrentWorkingDirectory();
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "Set test directory: " << test.Directory << std::endl,
                     this->Quiet);

  test.IsInBasedOnREOptions = true;
  test.WillFail = false;
  test.Disabled = false;
  test.RunSerial = false;
  test.Timeout = cmDuration::zero();
  test.ExplicitTimeout = false;
  test.Cost = 0;
  test.Processors = 1;
  test.WantAffinity = false;
  test.SkipReturnCode = -1;
  test.PreviousRuns = 0;
  if (this->UseIncludeRegExpFlag &&
      (!this->IncludeTestsRegularExpression.find(testname) ||
       (!this->UseExcludeRegExpFirst &&
        this->ExcludeTestsRegularExpression.find(testname)))) {
    test.IsInBasedOnREOptions = false;
  }
  this->TestList.push_back(test);
  return true;
}